

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureVkImpl.cpp
# Opt level: O2

void __thiscall Diligent::TextureVkImpl::InitSparseProperties(TextureVkImpl *this)

{
  RESOURCE_DIMENSION RVar1;
  VulkanLogicalDevice *this_00;
  SparseTextureProperties *pSVar2;
  pointer __p;
  SPARSE_TEXTURE_FLAGS SVar3;
  uint uVar4;
  ulong uVar5;
  char (*pacVar6) [63];
  char *pcVar7;
  TextureFormatAttribs *pTVar8;
  char (*in_RCX) [29];
  char (*Args_1) [100];
  char (*Args_1_00) [63];
  char *pcVar9;
  string msg_2;
  uint32_t SparseReqCount;
  VkMemoryRequirements MemReq;
  VkSparseImageMemoryRequirements SparseReq [2];
  
  if ((this->super_TextureBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
      .m_Desc.Usage != USAGE_SPARSE) {
    FormatString<char[26],char[29]>
              ((string *)SparseReq,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_Desc.Usage == USAGE_SPARSE",in_RCX);
    in_RCX = (char (*) [29])0x3cc;
    DebugAssertionFailed
              ((Char *)CONCAT44(SparseReq[0].formatProperties.imageGranularity.width,
                                SparseReq[0].formatProperties.aspectMask),"InitSparseProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x3cc);
    std::__cxx11::string::~string((string *)SparseReq);
  }
  if ((this->super_TextureBase<Diligent::EngineVkImplTraits>).m_pSparseProps._M_t.
      super___uniq_ptr_impl<Diligent::SparseTextureProperties,_std::default_delete<Diligent::SparseTextureProperties>_>
      ._M_t.
      super__Tuple_impl<0UL,_Diligent::SparseTextureProperties_*,_std::default_delete<Diligent::SparseTextureProperties>_>
      .super__Head_base<0UL,_Diligent::SparseTextureProperties_*,_false>._M_head_impl !=
      (SparseTextureProperties *)0x0) {
    FormatString<char[26],char[26]>
              ((string *)SparseReq,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pSparseProps == nullptr",(char (*) [26])in_RCX);
    DebugAssertionFailed
              ((Char *)CONCAT44(SparseReq[0].formatProperties.imageGranularity.width,
                                SparseReq[0].formatProperties.aspectMask),"InitSparseProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x3cd);
    std::__cxx11::string::~string((string *)SparseReq);
  }
  std::make_unique<Diligent::SparseTextureProperties>();
  __p = (pointer)CONCAT44(SparseReq[0].formatProperties.imageGranularity.width,
                          SparseReq[0].formatProperties.aspectMask);
  SparseReq[0].formatProperties.aspectMask = 0;
  SparseReq[0].formatProperties.imageGranularity.width = 0;
  std::
  __uniq_ptr_impl<Diligent::SparseTextureProperties,_std::default_delete<Diligent::SparseTextureProperties>_>
  ::reset((__uniq_ptr_impl<Diligent::SparseTextureProperties,_std::default_delete<Diligent::SparseTextureProperties>_>
           *)&(this->super_TextureBase<Diligent::EngineVkImplTraits>).m_pSparseProps,__p);
  std::
  unique_ptr<Diligent::SparseTextureProperties,_std::default_delete<Diligent::SparseTextureProperties>_>
  ::~unique_ptr((unique_ptr<Diligent::SparseTextureProperties,_std::default_delete<Diligent::SparseTextureProperties>_>
                 *)SparseReq);
  this_00 = (((this->super_TextureBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
             .m_pDevice)->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  VulkanUtilities::VulkanLogicalDevice::GetImageMemoryRequirements
            (&MemReq,this_00,(this->m_VulkanImage).m_VkObject);
  SparseReqCount = 0;
  (*vkGetImageSparseMemoryRequirements)
            (this_00->m_VkDevice,(this->m_VulkanImage).m_VkObject,&SparseReqCount,
             (VkSparseImageMemoryRequirements *)0x0);
  if (SparseReqCount != 1) {
    LogError<true,char[49]>
              (false,"InitSparseProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x3d8,(char (*) [49])"Sparse memory requirements for texture must be 1");
  }
  SparseReq[1].imageMipTailOffset = 0;
  SparseReq[1].imageMipTailStride = 0;
  SparseReq[1].formatProperties.flags = 0;
  SparseReq[1].imageMipTailFirstLod = 0;
  SparseReq[1].imageMipTailSize = 0;
  SparseReq[1].formatProperties.aspectMask = 0;
  SparseReq[1].formatProperties.imageGranularity.width = 0;
  SparseReq[1].formatProperties.imageGranularity.height = 0;
  SparseReq[1].formatProperties.imageGranularity.depth = 0;
  SparseReq[0].imageMipTailOffset = 0;
  SparseReq[0].imageMipTailStride = 0;
  SparseReq[0].formatProperties.flags = 0;
  SparseReq[0].imageMipTailFirstLod = 0;
  SparseReq[0].imageMipTailSize = 0;
  SparseReq[0].formatProperties.aspectMask = 0;
  SparseReq[0].formatProperties.imageGranularity.width = 0;
  SparseReq[0].formatProperties.imageGranularity.height = 0;
  SparseReq[0].formatProperties.imageGranularity.depth = 0;
  (*vkGetImageSparseMemoryRequirements)
            (this_00->m_VkDevice,(this->m_VulkanImage).m_VkObject,&SparseReqCount,SparseReq);
  pSVar2 = (this->super_TextureBase<Diligent::EngineVkImplTraits>).m_pSparseProps._M_t.
           super___uniq_ptr_impl<Diligent::SparseTextureProperties,_std::default_delete<Diligent::SparseTextureProperties>_>
           ._M_t.
           super__Tuple_impl<0UL,_Diligent::SparseTextureProperties_*,_std::default_delete<Diligent::SparseTextureProperties>_>
           .super__Head_base<0UL,_Diligent::SparseTextureProperties_*,_false>._M_head_impl;
  pSVar2->MipTailSize = SparseReq[0].imageMipTailSize;
  pSVar2->MipTailOffset = SparseReq[0].imageMipTailOffset;
  pSVar2->MipTailStride = SparseReq[0].imageMipTailStride;
  pSVar2->FirstMipInTail = SparseReq[0].imageMipTailFirstLod;
  *(ulong *)pSVar2->TileSize =
       CONCAT44(SparseReq[0].formatProperties.imageGranularity.height,
                SparseReq[0].formatProperties.imageGranularity.width);
  pSVar2->TileSize[2] = SparseReq[0].formatProperties.imageGranularity.depth;
  SVar3 = VkSparseImageFormatFlagsToSparseTextureFlags(SparseReq[0].formatProperties.flags);
  pSVar2->Flags = SVar3;
  RVar1 = (this->super_TextureBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
          .m_Desc.Type;
  uVar4 = (uint)RVar1;
  if (((RVar1 < 9) && ((0x1a8U >> (RVar1 & 0x1f) & 1) != 0)) &&
     ((this->super_TextureBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
      .m_Desc.field_3.ArraySize != 1)) {
    if ((SVar3 & SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL) == SPARSE_TEXTURE_FLAG_NONE) {
      Args_1_00 = (char (*) [63])pSVar2->MipTailStride;
      if (Args_1_00 == (char (*) [63])0x0) {
        FormatString<char[26],char[24]>
                  (&msg_2,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"Props.MipTailStride > 0",(char (*) [24])0x0);
        DebugAssertionFailed
                  (msg_2._M_dataplus._M_p,"InitSparseProperties",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                   ,0x3f3);
        std::__cxx11::string::~string((string *)&msg_2);
        Args_1_00 = (char (*) [63])pSVar2->MipTailStride;
        uVar4 = (uint)(this->super_TextureBase<Diligent::EngineVkImplTraits>).
                      super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                      .m_Desc.Type;
      }
    }
    else {
      pSVar2->MipTailStride = 0;
      Args_1_00 = (char (*) [63])0x0;
    }
    uVar5 = 1;
    if (((byte)uVar4 < 9) && ((0x1a8U >> (uVar4 & 0x1f) & 1) != 0)) {
      uVar5 = (ulong)(this->super_TextureBase<Diligent::EngineVkImplTraits>).
                     super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                     .m_Desc.field_3.ArraySize;
    }
    if (uVar5 * (long)Args_1_00 - MemReq.size != 0) {
      FormatString<char[26],char[59]>
                (&msg_2,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Props.MipTailStride * m_Desc.GetArraySize() == MemReq.size",
                 (char (*) [59])Args_1_00);
      DebugAssertionFailed
                (msg_2._M_dataplus._M_p,"InitSparseProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,0x3f5);
      std::__cxx11::string::~string((string *)&msg_2);
      Args_1_00 = (char (*) [63])pSVar2->MipTailStride;
    }
    if ((ulong)Args_1_00 % MemReq.alignment != 0) {
      FormatString<char[26],char[44]>
                (&msg_2,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Props.MipTailStride % MemReq.alignment == 0",
                 (char (*) [44])Args_1_00);
      DebugAssertionFailed
                (msg_2._M_dataplus._M_p,"InitSparseProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,0x3f6);
      std::__cxx11::string::~string((string *)&msg_2);
      Args_1_00 = (char (*) [63])pSVar2->MipTailStride;
    }
    pacVar6 = (char (*) [63])pSVar2->MipTailOffset;
    if (Args_1_00 <= pacVar6) {
      FormatString<char[26],char[42]>
                (&msg_2,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Props.MipTailOffset < Props.MipTailStride",(char (*) [42])Args_1_00
                );
      DebugAssertionFailed
                (msg_2._M_dataplus._M_p,"InitSparseProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,0x3f7);
      std::__cxx11::string::~string((string *)&msg_2);
      pacVar6 = (char (*) [63])pSVar2->MipTailOffset;
      Args_1_00 = (char (*) [63])pSVar2->MipTailStride;
    }
    if (Args_1_00 < (char (*) [63])((long)*pacVar6 + pSVar2->MipTailSize)) {
      FormatString<char[26],char[63]>
                (&msg_2,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Props.MipTailOffset + Props.MipTailSize <= Props.MipTailStride",
                 Args_1_00);
      DebugAssertionFailed
                (msg_2._M_dataplus._M_p,"InitSparseProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,0x3f8);
      std::__cxx11::string::~string((string *)&msg_2);
    }
  }
  else {
    pcVar7 = (char *)pSVar2->MipTailOffset;
    Args_1 = (char (*) [100])pSVar2->MipTailSize;
    pcVar9 = (char *)MemReq.size;
    if (MemReq.size <= pcVar7) {
      if ((char *)MemReq.size == pcVar7 && Args_1 == (char (*) [100])0x0) {
        Args_1 = (char (*) [100])0x0;
        pcVar9 = pcVar7;
      }
      else {
        FormatString<char[26],char[100]>
                  (&msg_2,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "Props.MipTailOffset < MemReq.size || (Props.MipTailOffset == MemReq.size && Props.MipTailSize == 0)"
                   ,Args_1);
        DebugAssertionFailed
                  (msg_2._M_dataplus._M_p,"InitSparseProperties",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                   ,0x3ea);
        std::__cxx11::string::~string((string *)&msg_2);
        pcVar7 = (char *)pSVar2->MipTailOffset;
        Args_1 = (char (*) [100])pSVar2->MipTailSize;
        pcVar9 = (char *)MemReq.size;
      }
    }
    if (pcVar9 < *Args_1 + (long)pcVar7) {
      FormatString<char[26],char[55]>
                (&msg_2,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Props.MipTailOffset + Props.MipTailSize <= MemReq.size",
                 (char (*) [55])(*Args_1 + (long)pcVar7));
      DebugAssertionFailed
                (msg_2._M_dataplus._M_p,"InitSparseProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,0x3eb);
      std::__cxx11::string::~string((string *)&msg_2);
    }
    pSVar2->MipTailStride = 0;
  }
  pSVar2->AddressSpaceSize = MemReq.size;
  uVar4 = StaticCast<unsigned_int,unsigned_long>(&MemReq.alignment);
  pSVar2->BlockSize = uVar4;
  pTVar8 = GetTextureFormatAttribs
                     ((this->super_TextureBase<Diligent::EngineVkImplTraits>).
                      super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                      .m_Desc.Format);
  uVar4 = 1;
  if (pTVar8->ComponentType != COMPONENT_TYPE_COMPRESSED) {
    uVar4 = (uint)pTVar8->NumComponents;
  }
  if (uVar4 * pTVar8->ComponentSize * (pSVar2->TileSize[0] / (uint)pTVar8->BlockWidth) *
      (pSVar2->TileSize[1] / (uint)pTVar8->BlockHeight) * pSVar2->TileSize[2] *
      (this->super_TextureBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
      .m_Desc.SampleCount != pSVar2->BlockSize) {
    FormatString<char[52]>
              (&msg_2,(char (*) [52])"Expected that memory alignment equals to block size");
    DebugAssertionFailed
              (msg_2._M_dataplus._M_p,"InitSparseProperties",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x406);
    std::__cxx11::string::~string((string *)&msg_2);
  }
  return;
}

Assistant:

void TextureVkImpl::InitSparseProperties() noexcept(false)
{
    VERIFY_EXPR(m_Desc.Usage == USAGE_SPARSE);
    VERIFY_EXPR(m_pSparseProps == nullptr);

    m_pSparseProps = std::make_unique<SparseTextureProperties>();

    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_pDevice->GetLogicalDevice();
    const VkMemoryRequirements                  MemReq        = LogicalDevice.GetImageMemoryRequirements(GetVkImage());

    // If the image was not created with VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT, then pSparseMemoryRequirementCount will be set to zero.
    uint32_t SparseReqCount = 0;
    vkGetImageSparseMemoryRequirements(LogicalDevice.GetVkDevice(), GetVkImage(), &SparseReqCount, nullptr);
    if (SparseReqCount != 1)
        LOG_ERROR_AND_THROW("Sparse memory requirements for texture must be 1");

    // Texture with depth-stencil format may be implemented with two memory blocks per tile.
    VkSparseImageMemoryRequirements SparseReq[2] = {};
    vkGetImageSparseMemoryRequirements(LogicalDevice.GetVkDevice(), GetVkImage(), &SparseReqCount, SparseReq);

    SparseTextureProperties& Props{*m_pSparseProps};
    Props.MipTailOffset  = SparseReq[0].imageMipTailOffset;
    Props.MipTailSize    = SparseReq[0].imageMipTailSize;
    Props.MipTailStride  = SparseReq[0].imageMipTailStride;
    Props.FirstMipInTail = SparseReq[0].imageMipTailFirstLod;
    Props.TileSize[0]    = SparseReq[0].formatProperties.imageGranularity.width;
    Props.TileSize[1]    = SparseReq[0].formatProperties.imageGranularity.height;
    Props.TileSize[2]    = SparseReq[0].formatProperties.imageGranularity.depth;
    Props.Flags          = VkSparseImageFormatFlagsToSparseTextureFlags(SparseReq[0].formatProperties.flags);

    if (m_Desc.GetArraySize() == 1)
    {
        VERIFY_EXPR(Props.MipTailOffset < MemReq.size || (Props.MipTailOffset == MemReq.size && Props.MipTailSize == 0));
        VERIFY_EXPR(Props.MipTailOffset + Props.MipTailSize <= MemReq.size);
        Props.MipTailStride = 0;
    }
    else
    {
        if (Props.Flags & SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL)
            Props.MipTailStride = 0;
        else
            VERIFY_EXPR(Props.MipTailStride > 0);

        VERIFY_EXPR(Props.MipTailStride * m_Desc.GetArraySize() == MemReq.size);
        VERIFY_EXPR(Props.MipTailStride % MemReq.alignment == 0);
        VERIFY_EXPR(Props.MipTailOffset < Props.MipTailStride);
        VERIFY_EXPR(Props.MipTailOffset + Props.MipTailSize <= Props.MipTailStride);
    }

    Props.AddressSpaceSize = MemReq.size;
    Props.BlockSize        = StaticCast<Uint32>(MemReq.alignment);

#ifdef DILIGENT_DEBUG
    const TextureFormatAttribs& FmtAttribs    = GetTextureFormatAttribs(m_Desc.Format);
    const Uint32                BytesPerBlock = FmtAttribs.GetElementSize();
    const Uint32                BytesPerTile =
        (Props.TileSize[0] / FmtAttribs.BlockWidth) *
        (Props.TileSize[1] / FmtAttribs.BlockHeight) *
        Props.TileSize[2] * m_Desc.SampleCount * BytesPerBlock;

    VERIFY(BytesPerTile == Props.BlockSize, "Expected that memory alignment equals to block size");
#endif
}